

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyClient.cpp
# Opt level: O0

void __thiscall ProxyClient::stop(ProxyClient *this,function<void_()> *closeCall)

{
  pointer pCVar1;
  pointer pTVar2;
  function<void_()> *closeCall_local;
  ProxyClient *this_local;
  
  std::function<void_()>::operator=(&this->m_stopCall,closeCall);
  if (this->m_runStatus == RUN) {
    this->m_runStatus = STOP_ING;
    pCVar1 = std::unique_ptr<net_uv::Client,_std::default_delete<net_uv::Client>_>::operator->
                       (&this->m_pipe);
    (*(pCVar1->super_Runnable)._vptr_Runnable[7])();
    pTVar2 = std::unique_ptr<net_uv::TCPServer,_std::default_delete<net_uv::TCPServer>_>::operator->
                       (&this->m_tcpSvr);
    (*(pTVar2->super_Server).super_Runnable._vptr_Runnable[7])();
  }
  return;
}

Assistant:

void ProxyClient::stop(const std::function<void()>& closeCall)
{
	m_stopCall = closeCall;
	if(m_runStatus == RUN_STATUS::RUN)
	{
		m_runStatus = RUN_STATUS::STOP_ING;
		m_pipe->closeClient();
		m_tcpSvr->stopServer();
	}
}